

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

vector<CSegment_*,_std::allocator<CSegment_*>_> * __thiscall
CWire::GetSegmentList(CWire *this,int iIndex)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int iIndex_local;
  CWire *this_local;
  
  bVar1 = false;
  if (-1 < iIndex) {
    iVar2 = GetNumSegmentList(this);
    bVar1 = iIndex < iVar2;
  }
  if (!bVar1) {
    __assert_fail("iIndex>=0&&iIndex<GetNumSegmentList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x286,"vector<CSegment *> *CWire::GetSegmentList(int)");
  }
  pvVar3 = std::
           vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
           ::operator[](&this->m_SegmentList,(long)iIndex);
  return pvVar3;
}

Assistant:

vector<CSegment*>* CWire::GetSegmentList(int iIndex)
{
	assert(iIndex>=0&&iIndex<GetNumSegmentList());
	return	&m_SegmentList[iIndex];
}